

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O2

void TPZShapeHDivConstantBound<pzshape::TPZShapeTriang>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  long columns;
  long col;
  double dVar4;
  TPZVec<double> qsi;
  TPZFMatrix<double> curlPhiAux;
  TPZFMatrix<double> phiAux;
  
  pztopology::TPZTriangle::NumSides(1);
  TPZShapeH1<pzshape::TPZShapeTriang>::Shape(pt,data);
  dVar4 = (double)*(data->fSideOrient).super_TPZVec<int>.fStore;
  pdVar3 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar3 = dVar4 + dVar4;
  iVar1 = TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::NHCurlShapeF(data);
  columns = (long)iVar1;
  TPZFMatrix<double>::TPZFMatrix(&phiAux,2,columns);
  TPZFMatrix<double>::TPZFMatrix(&curlPhiAux,1,columns);
  memset(curlPhiAux.fElem,0,
         curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  TPZVec<double>::TPZVec(&qsi,pt);
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::Shape(&qsi,data,&phiAux,&curlPhiAux);
  iVar1 = 1;
  iVar2 = pztopology::TPZTriangle::NumSides(1);
  for (col = (long)iVar2; col < columns; col = col + 1) {
    pdVar3 = TPZFMatrix<double>::operator()(&curlPhiAux,0,col);
    dVar4 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(phi,(long)iVar1,0);
    *pdVar3 = dVar4;
    iVar1 = iVar1 + 1;
  }
  TPZVec<double>::~TPZVec(&qsi);
  TPZFMatrix<double>::~TPZFMatrix(&curlPhiAux);
  TPZFMatrix<double>::~TPZFMatrix(&phiAux);
  return;
}

Assistant:

void TPZShapeHDivConstantBound<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi) {

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const auto nEdges = TSHAPE::NumSides(1);
    TPZShapeH1<TSHAPE>::Shape(pt,data);

    if (dim == 1){
        phi(0,0) = 0.5 * data.fSideOrient[0];

        int nshape = data.fPhi.Rows();

        for (int i = 0; i < nshape-ncorner; i++){
            phi(i+1,0) = -data.fDPhi(0,i+ncorner);
        }
    } else if (dim == 2) {
        
        
        if (TSHAPE::Type() == EQuadrilateral){
            phi(0,0) = 0.25 * data.fSideOrient[0];
        } else if (TSHAPE::Type() == ETriangle){
            phi(0,0) = 2. * data.fSideOrient[0];
        }

        int nshape = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);

        TPZFMatrix<REAL> phiAux(2,nshape),curlPhiAux(1,nshape);
        curlPhiAux.Zero();
        auto qsi = pt;
        TPZShapeHCurlNoGrads<TSHAPE>::Shape(qsi,data,phiAux,curlPhiAux);

        auto nEdges = TSHAPE::NumSides(1); 
       
        for (int i = nEdges; i < nshape; i++)
        {
            phi(i-nEdges+1,0) = curlPhiAux(0,i);
        }
        
    } else {
        DebugStop();
    }


}